

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::batch_normalize_inference
               (double eps,resizable_tensor *dest,tensor *src,tensor *gamma,tensor *beta,
               tensor *running_means,tensor *running_variances)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ostream *poVar11;
  undefined8 uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar13;
  tensor *in_RCX;
  tensor *in_RDX;
  tensor *in_RSI;
  long *in_RDI;
  tensor *in_R8;
  tensor *in_R9;
  double in_XMM0_Qa;
  double dVar14;
  long k;
  long n;
  long num;
  float *v;
  float *m;
  float *b;
  float *g;
  float *s;
  float *d;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffb80;
  tensor *in_stack_fffffffffffffb88;
  resizable_tensor *in_stack_fffffffffffffb90;
  long local_230;
  long local_228;
  float *local_1f8;
  float *local_1f0;
  ostream local_1b0;
  tensor *local_38;
  tensor *local_30;
  tensor *local_28;
  tensor *local_20;
  tensor *local_18;
  long *local_10;
  double local_8;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_XMM0_Qa;
  lVar9 = tensor::num_samples(in_RDX);
  if (lVar9 == 1) {
    lVar9 = tensor::nr(local_20);
    lVar10 = tensor::nr(local_18);
    if (lVar9 == lVar10) {
      lVar9 = tensor::nc(local_20);
      lVar10 = tensor::nc(local_18);
      if (lVar9 == lVar10) {
        lVar9 = tensor::k(local_20);
        lVar10 = tensor::k(local_18);
        if ((((lVar9 == lVar10) &&
             (bVar4 = have_same_dimensions
                                (&in_stack_fffffffffffffb90->super_tensor,in_stack_fffffffffffffb88)
             , bVar4)) &&
            (bVar4 = have_same_dimensions
                               (&in_stack_fffffffffffffb90->super_tensor,in_stack_fffffffffffffb88),
            bVar4)) &&
           ((bVar4 = have_same_dimensions
                               (&in_stack_fffffffffffffb90->super_tensor,in_stack_fffffffffffffb88),
            bVar4 && (0.0 < local_8)))) {
          resizable_tensor::copy_size(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          local_1f0 = (float *)(**(code **)(*local_10 + 0x18))();
          iVar5 = (*local_18->_vptr_tensor[2])();
          local_1f8 = (float *)CONCAT44(extraout_var,iVar5);
          iVar5 = (*local_20->_vptr_tensor[2])();
          iVar6 = (*local_28->_vptr_tensor[2])();
          iVar7 = (*local_30->_vptr_tensor[2])();
          iVar8 = (*local_38->_vptr_tensor[2])();
          lVar10 = tensor::k(local_18);
          lVar9 = tensor::nr(local_18);
          lVar10 = lVar10 * lVar9;
          lVar9 = tensor::nc(local_18);
          for (local_228 = 0; lVar13 = tensor::num_samples(local_18), local_228 < lVar13;
              local_228 = local_228 + 1) {
            for (local_230 = 0; local_230 < lVar10 * lVar9; local_230 = local_230 + 1) {
              fVar1 = *(float *)(CONCAT44(extraout_var_00,iVar5) + local_230 * 4);
              fVar2 = *local_1f8;
              fVar3 = *(float *)(CONCAT44(extraout_var_02,iVar7) + local_230 * 4);
              dVar14 = sqrt((double)*(float *)(CONCAT44(extraout_var_03,iVar8) + local_230 * 4) +
                            local_8);
              *local_1f0 = (float)((double)(fVar1 * (fVar2 - fVar3)) / dVar14 +
                                  (double)*(float *)(CONCAT44(extraout_var_01,iVar6) + local_230 * 4
                                                    ));
              local_1f0 = local_1f0 + 1;
              local_1f8 = local_1f8 + 1;
            }
          }
          return;
        }
      }
    }
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  poVar11 = std::operator<<(&local_1b0,"\n\nError detected at line ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x2ae);
  std::operator<<(poVar11,".\n");
  poVar11 = std::operator<<(&local_1b0,"Error detected in file ");
  poVar11 = std::operator<<(poVar11,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                           );
  std::operator<<(poVar11,".\n");
  poVar11 = std::operator<<(&local_1b0,"Error detected in function ");
  poVar11 = std::operator<<(poVar11,
                            "void dlib::cpu::batch_normalize_inference(const double, resizable_tensor &, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &)"
                           );
  std::operator<<(poVar11,".\n\n");
  poVar11 = std::operator<<(&local_1b0,"Failing expression was ");
  poVar11 = std::operator<<(poVar11,
                            "gamma.num_samples() == 1 && gamma.nr() == src.nr() && gamma.nc() == src.nc() && gamma.k() == src.k() && have_same_dimensions(gamma, beta) && have_same_dimensions(gamma, running_means) && have_same_dimensions(gamma, running_variances) && eps > 0"
                           );
  std::operator<<(poVar11,".\n");
  poVar11 = (ostream *)std::ostream::operator<<(&local_1b0,std::boolalpha);
  poVar11 = std::operator<<(poVar11,"\ngamma.num_samples(): ");
  lVar9 = tensor::num_samples(local_20);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\ngamma.k():  ");
  lVar9 = tensor::k(local_20);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\ngamma.nr(): ");
  lVar9 = tensor::nr(local_20);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\ngamma.nc(): ");
  lVar9 = tensor::nc(local_20);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nbeta.num_samples(): ");
  lVar9 = tensor::num_samples(local_28);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nbeta.k():   ");
  lVar9 = tensor::k(local_28);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nbeta.nr():  ");
  lVar9 = tensor::nr(local_28);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nbeta.nc():  ");
  lVar9 = tensor::nc(local_28);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nrunning_means.num_samples(): ");
  lVar9 = tensor::num_samples(local_30);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nrunning_means.k():   ");
  lVar9 = tensor::k(local_30);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nrunning_means.nr():  ");
  lVar9 = tensor::nr(local_30);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nrunning_means.nc():  ");
  lVar9 = tensor::nc(local_30);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nrunning_variances.num_samples(): ");
  lVar9 = tensor::num_samples(local_38);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nrunning_variances.k():   ");
  lVar9 = tensor::k(local_38);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nrunning_variances.nr():  ");
  lVar9 = tensor::nr(local_38);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nrunning_variances.nc():  ");
  lVar9 = tensor::nc(local_38);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nsrc.k():   ");
  lVar9 = tensor::k(local_18);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nsrc.nr():  ");
  lVar9 = tensor::nr(local_18);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\nsrc.nc():  ");
  lVar9 = tensor::nc(local_18);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,lVar9);
  poVar11 = std::operator<<(poVar11,"\neps:  ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_8);
  std::operator<<(poVar11,"\n");
  uVar12 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error
            ((fatal_error *)poVar11,(error_type)((ulong)uVar12 >> 0x20),in_stack_fffffffffffffb80);
  __cxa_throw(uVar12,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void batch_normalize_inference (
            const double eps,
            resizable_tensor& dest,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta,
            const tensor& running_means,
            const tensor& running_variances
        )
        {
            DLIB_CASSERT(
                gamma.num_samples() == 1 && 
                gamma.nr() == src.nr() &&
                gamma.nc() == src.nc() &&
                gamma.k()  == src.k() &&
                have_same_dimensions(gamma, beta) &&
                have_same_dimensions(gamma, running_means) &&
                have_same_dimensions(gamma, running_variances) && 
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nrunning_means.num_samples(): " << running_means.num_samples() << 
                "\nrunning_means.k():   " << running_means.k() << 
                "\nrunning_means.nr():  " << running_means.nr() << 
                "\nrunning_means.nc():  " << running_means.nc() << 
                "\nrunning_variances.num_samples(): " << running_variances.num_samples() << 
                "\nrunning_variances.k():   " << running_variances.k() << 
                "\nrunning_variances.nr():  " << running_variances.nr() << 
                "\nrunning_variances.nc():  " << running_variances.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );
            dest.copy_size(src);

            auto d = dest.host();
            auto s = src.host();
            auto g = gamma.host();
            auto b = beta.host();
            auto m = running_means.host();
            auto v = running_variances.host();

            const long num = src.k()*src.nr()*src.nc();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < num; ++k)
                {
                    *d = g[k]*(*s - m[k])/std::sqrt(v[k]+eps) + b[k];
                    ++d;
                    ++s;
                }
            }
        }